

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

void Json::CharReaderBuilder::setDefaults(Value *settings)

{
  Value *pVVar1;
  Value local_1b0;
  Value local_188;
  Value local_160;
  Value local_138;
  Value local_110;
  Value local_e8;
  Value local_c0;
  Value local_98;
  Value local_70;
  Value local_38;
  Value *local_10;
  Value *settings_local;
  
  local_10 = settings;
  Value::Value(&local_38,true);
  pVVar1 = Value::operator[](local_10,"collectComments");
  Value::operator=(pVVar1,&local_38);
  Value::~Value(&local_38);
  Value::Value(&local_70,true);
  pVVar1 = Value::operator[](local_10,"allowComments");
  Value::operator=(pVVar1,&local_70);
  Value::~Value(&local_70);
  Value::Value(&local_98,false);
  pVVar1 = Value::operator[](local_10,"strictRoot");
  Value::operator=(pVVar1,&local_98);
  Value::~Value(&local_98);
  Value::Value(&local_c0,false);
  pVVar1 = Value::operator[](local_10,"allowDroppedNullPlaceholders");
  Value::operator=(pVVar1,&local_c0);
  Value::~Value(&local_c0);
  Value::Value(&local_e8,false);
  pVVar1 = Value::operator[](local_10,"allowNumericKeys");
  Value::operator=(pVVar1,&local_e8);
  Value::~Value(&local_e8);
  Value::Value(&local_110,false);
  pVVar1 = Value::operator[](local_10,"allowSingleQuotes");
  Value::operator=(pVVar1,&local_110);
  Value::~Value(&local_110);
  Value::Value(&local_138,1000);
  pVVar1 = Value::operator[](local_10,"stackLimit");
  Value::operator=(pVVar1,&local_138);
  Value::~Value(&local_138);
  Value::Value(&local_160,false);
  pVVar1 = Value::operator[](local_10,"failIfExtra");
  Value::operator=(pVVar1,&local_160);
  Value::~Value(&local_160);
  Value::Value(&local_188,false);
  pVVar1 = Value::operator[](local_10,"rejectDupKeys");
  Value::operator=(pVVar1,&local_188);
  Value::~Value(&local_188);
  Value::Value(&local_1b0,false);
  pVVar1 = Value::operator[](local_10,"allowSpecialFloats");
  Value::operator=(pVVar1,&local_1b0);
  Value::~Value(&local_1b0);
  return;
}

Assistant:

void CharReaderBuilder::setDefaults(Json::Value* settings)
{
//! [CharReaderBuilderDefaults]
  (*settings)["collectComments"] = true;
  (*settings)["allowComments"] = true;
  (*settings)["strictRoot"] = false;
  (*settings)["allowDroppedNullPlaceholders"] = false;
  (*settings)["allowNumericKeys"] = false;
  (*settings)["allowSingleQuotes"] = false;
  (*settings)["stackLimit"] = 1000;
  (*settings)["failIfExtra"] = false;
  (*settings)["rejectDupKeys"] = false;
  (*settings)["allowSpecialFloats"] = false;
//! [CharReaderBuilderDefaults]
}